

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.hpp
# Opt level: O0

void __thiscall tcu::TestRunStatus::clear(TestRunStatus *this)

{
  TestRunStatus *this_local;
  
  this->numExecuted = 0;
  this->numPassed = 0;
  this->numFailed = 0;
  this->numNotSupported = 0;
  this->numWarnings = 0;
  this->isComplete = false;
  return;
}

Assistant:

void clear (void)
	{
		numExecuted		= 0;
		numPassed		= 0;
		numFailed		= 0;
		numNotSupported	= 0;
		numWarnings		= 0;
		isComplete		= false;
	}